

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::XMLReader::getNCName(XMLReader *this,XMLBuffer *toFill)

{
  XMLCh XVar1;
  bool bVar2;
  XMLSize_t XVar3;
  ulong uVar4;
  XMLSize_t XVar5;
  
  if ((this->fCharIndex != this->fCharsAvail) || (bVar2 = refreshCharBuffer(this), bVar2)) {
    XVar5 = this->fCharIndex;
    XVar1 = this->fCharBuf[XVar5];
    if ((ushort)(XVar1 + L'⠀') < 0x380) {
      if (XVar5 + 1 == this->fCharsAvail) {
        bVar2 = refreshCharBuffer(this);
        if (!bVar2) goto LAB_002c52f8;
        XVar5 = this->fCharIndex;
      }
      if ((ushort)(this->fCharBuf[this->fCharIndex + 1] + L'\x2000') < 0xfc00) goto LAB_002c52f8;
      XVar3 = this->fCharIndex + 2;
    }
    else {
      if ((ulong)(ushort)XVar1 == 0x3a) {
        return false;
      }
      if ((this->fgCharCharsTable[(ushort)XVar1] & 2) == 0) {
        return false;
      }
      XVar3 = XVar5 + 1;
    }
    this->fCharIndex = XVar3;
    do {
      if (this->fCharIndex == this->fCharsAvail) {
        XVar3 = this->fCharIndex - XVar5;
        if (XVar3 != 0) {
          this->fCurCol = this->fCurCol + XVar3;
          XMLBuffer::append(toFill,this->fCharBuf + XVar5,XVar3);
        }
        bVar2 = refreshCharBuffer(this);
        if (!bVar2) {
          return true;
        }
        XVar5 = this->fCharIndex;
      }
      uVar4 = this->fCharIndex;
      while (uVar4 < this->fCharsAvail) {
        if ((ushort)(this->fCharBuf[uVar4] + L'⠀') < 0x380) {
          if (uVar4 + 1 == this->fCharsAvail) {
            XVar3 = uVar4 - XVar5;
            if (XVar3 != 0) {
              this->fCurCol = this->fCurCol + XVar3;
              XMLBuffer::append(toFill,this->fCharBuf + XVar5,XVar3);
            }
            bVar2 = refreshCharBuffer(this);
            if (!bVar2) break;
            XVar5 = this->fCharIndex;
          }
          if ((ushort)(this->fCharBuf[this->fCharIndex + 1] + L'\x2000') < 0xfc00) break;
          uVar4 = this->fCharIndex + 2;
        }
        else {
          if ((this->fgCharCharsTable[(ushort)this->fCharBuf[uVar4]] & 1) == 0) break;
          uVar4 = uVar4 + 1;
        }
        this->fCharIndex = uVar4;
      }
    } while (this->fCharIndex == this->fCharsAvail);
    bVar2 = true;
    XVar3 = this->fCharIndex - XVar5;
    if (XVar3 != 0) {
      this->fCurCol = this->fCurCol + XVar3;
      XMLBuffer::append(toFill,this->fCharBuf + XVar5,XVar3);
    }
  }
  else {
LAB_002c52f8:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool XMLReader::getNCName(XMLBuffer& toFill)
{
    if (fCharIndex == fCharsAvail && !refreshCharBuffer())
        return false;

    XMLSize_t charIndex_start = fCharIndex, count;
    //  Lets check the first char for being a first name char. If not, then
    //  what's the point in living mannnn? Just give up now. We only do this
    //  if its a name and not a name token that they want.
    if ((fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F)) {
        // if there isn't one more char in the buffer, read more data
        if (fCharIndex+1 == fCharsAvail)
        {
            if (!refreshCharBuffer())
                return false;
            // reset the start buffer to the new location of the cursor
            charIndex_start = fCharIndex;
        }
        if ((fCharBuf[fCharIndex+1] < 0xDC00) || (fCharBuf[fCharIndex+1] > 0xDFFF))
            return false;

        // Looks ok, so lets eat it
        fCharIndex += 2;
    }
    else {
        if (!isFirstNCNameChar(fCharBuf[fCharIndex])) {
            return false;
        }

        // Looks ok, so lets eat it
        fCharIndex++;
    }

    do
    {
        if (fCharIndex == fCharsAvail)
        {
            // we have to copy the accepted character(s), and update the column number,
            // before getting new data and losing the value of fCharIndex
            if((count = fCharIndex - charIndex_start)!=0)
            {
                fCurCol += (XMLFileLoc)count;
                toFill.append(&fCharBuf[charIndex_start], count);
            }
            if(!refreshCharBuffer())
                return true;
            charIndex_start = fCharIndex;
        }

        //  Check the current char and take it if it's a name char
        while(fCharIndex < fCharsAvail)
        {
            if((fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F))
            {
                // if there isn't one more char in the buffer, read more data
                if (fCharIndex+1 == fCharsAvail)
                {
                    // but first copy the accepted character(s), and update column
                    if (fCharIndex != charIndex_start)
                    {
                        fCurCol += (XMLFileLoc)(fCharIndex - charIndex_start);
                        toFill.append(&fCharBuf[charIndex_start], fCharIndex - charIndex_start);
                    }

                    if (!refreshCharBuffer())
                        break;

                    charIndex_start = fCharIndex;
                }
                if ( (fCharBuf[fCharIndex+1] < 0xDC00) ||
                    (fCharBuf[fCharIndex+1] > 0xDFFF)  )
                    break;
                fCharIndex += 2;
            }
            else if(isNCNameChar(fCharBuf[fCharIndex])) fCharIndex++;
            else break;
        }
        // if we didn't consume the entire buffer, we are done
    } while(fCharIndex == fCharsAvail);

    // we have to copy the accepted character(s), and update column
    if((count = fCharIndex - charIndex_start)!=0)
    {
        fCurCol += (XMLFileLoc)count;
        toFill.append(&fCharBuf[charIndex_start], count);
    }
    return true;
}